

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O1

int Cudd_IsInHook(DdManager *dd,DD_HFP f,Cudd_HookType where)

{
  DdHook *pDVar1;
  
  if (where < 4) {
    for (pDVar1 = (&dd->preGCHook)[where]; pDVar1 != (DdHook *)0x0; pDVar1 = pDVar1->next) {
      if (pDVar1->f == f) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int
Cudd_IsInHook(
  DdManager * dd,
  DD_HFP f,
  Cudd_HookType where)
{
    DdHook *hook;

    switch (where) {
    case CUDD_PRE_GC_HOOK:
        hook = dd->preGCHook;
        break;
    case CUDD_POST_GC_HOOK:
        hook = dd->postGCHook;
        break;
    case CUDD_PRE_REORDERING_HOOK:
        hook = dd->preReorderingHook;
        break;
    case CUDD_POST_REORDERING_HOOK:
        hook = dd->postReorderingHook;
        break;
    default:
        return(0);
    }
    /* Scan the list and find whether the function is already there. */
    while (hook != NULL) {
        if (hook->f == f) {
            return(1);
        }
        hook = hook->next;
    }
    return(0);

}